

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_allocator_test.cc
# Opt level: O3

void __thiscall phmap::priv::anon_unknown_0::PropagateTest<6>::PropagateTest(PropagateTest<6> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  AssertionResult *pAVar2;
  CheckedAlloc<phmap::priv::Tracked<int>,_6> *pCVar3;
  CheckedAlloc<phmap::priv::Tracked<int>,_6> *value;
  CheckedAlloc<phmap::priv::Tracked<int>,_6> *value_00;
  char *pcVar4;
  string local_b0;
  undefined1 local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  undefined1 local_70 [8];
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  AssertHelper local_60;
  element_type *local_58;
  CheckedAlloc<phmap::priv::Tracked<int>,_6> *local_50;
  undefined1 local_48 [8];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__PropagateTest_00171ea0;
  (this->a1).id_ = 1;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00171b40;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[1]._M_use_count = 0;
  p_Var1[1]._M_weak_count = 0;
  p_Var1[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[2]._M_use_count = 0;
  p_Var1[2]._M_weak_count = 0;
  p_Var1[3]._vptr__Sp_counted_base = (_func_int **)(p_Var1 + 2);
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&p_Var1[3]._M_use_count = p_Var1 + 2;
  p_Var1[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  (this->a1).state_.
  super___shared_ptr<phmap::priv::(anonymous_namespace)::AllocState,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  (this->a1).state_.
  super___shared_ptr<phmap::priv::(anonymous_namespace)::AllocState,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)(p_Var1 + 1);
  (this->t1).size_ = 0;
  (this->t1).capacity_ = 0;
  (this->t1).ctrl_ = (ctrl_t *)0x0;
  (this->t1).slots_ = (slot_type *)0x0;
  (this->t1).settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
  .
  super__Tuple_impl<2UL,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
  .
  super__Tuple_impl<3UL,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
  .
  super__Head_base<3UL,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>,_false>
  ._M_head_impl.id_ = (this->a1).id_;
  (((shared_ptr<phmap::priv::(anonymous_namespace)::AllocState> *)
   ((long)&(this->t1).settings_.
           super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
           .
           super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
           .
           super__Tuple_impl<2UL,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
           .
           super__Tuple_impl<3UL,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
           .
           super__Head_base<3UL,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>,_false>
   + 8))->
  super___shared_ptr<phmap::priv::(anonymous_namespace)::AllocState,_(__gnu_cxx::_Lock_policy)2>).
  _M_ptr = (element_type *)(p_Var1 + 1);
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
  ((long)&(this->t1).settings_.
          super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
          .
          super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
          .
          super__Tuple_impl<2UL,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
          .
          super__Tuple_impl<3UL,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
          .
          super__Head_base<3UL,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>,_false>
  + 0x10))->_M_pi = p_Var1;
  if (__libc_single_threaded == '\0') {
    LOCK();
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    UNLOCK();
  }
  else {
    p_Var1->_M_use_count = 2;
  }
  (this->t1).settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0;
  (this->a2).id_ = 2;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00171b40;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[1]._M_use_count = 0;
  p_Var1[1]._M_weak_count = 0;
  p_Var1[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[2]._M_use_count = 0;
  p_Var1[2]._M_weak_count = 0;
  p_Var1[3]._vptr__Sp_counted_base = (_func_int **)(p_Var1 + 2);
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&p_Var1[3]._M_use_count = p_Var1 + 2;
  p_Var1[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  (this->a2).state_.
  super___shared_ptr<phmap::priv::(anonymous_namespace)::AllocState,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  (this->a2).state_.
  super___shared_ptr<phmap::priv::(anonymous_namespace)::AllocState,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)(p_Var1 + 1);
  local_b0._M_dataplus._M_p =
       (pointer)(this->t1).settings_.
                super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
                .
                super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
                .
                super__Tuple_impl<2UL,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
                .
                super__Tuple_impl<3UL,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
                .
                super__Head_base<3UL,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>,_false>
                ._M_head_impl.id_;
  local_b0._M_string_length =
       (size_type)
       (((shared_ptr<phmap::priv::(anonymous_namespace)::AllocState> *)
        ((long)&(this->t1).settings_.
                super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
                .
                super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
                .
                super__Tuple_impl<2UL,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
                .
                super__Tuple_impl<3UL,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
                .
                super__Head_base<3UL,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>,_false>
        + 8))->
       super___shared_ptr<phmap::priv::(anonymous_namespace)::AllocState,_(__gnu_cxx::_Lock_policy)2>
       )._M_ptr;
  local_b0.field_2._M_allocated_capacity =
       (size_type)
       ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
       ((long)&(this->t1).settings_.
               super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
               .
               super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
               .
               super__Tuple_impl<2UL,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
               .
               super__Tuple_impl<3UL,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
               .
               super__Head_base<3UL,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>,_false>
       + 0x10))->_M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0.field_2._M_allocated_capacity !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0.field_2._M_allocated_capacity)->
      _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_b0.field_2._M_allocated_capacity)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0.field_2._M_allocated_capacity)->
      _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_b0.field_2._M_allocated_capacity)->_M_use_count + 1;
    }
  }
  testing::internal::EqHelper::
  Compare<phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>,_nullptr>
            ((EqHelper *)local_90,"a1","t1.get_allocator()",&this->a1,
             (CheckedAlloc<phmap::priv::Tracked<int>,_6> *)&local_b0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0.field_2._M_allocated_capacity !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_b0.field_2._M_allocated_capacity);
  }
  if (local_90[0] == (EqHelper)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_88->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_allocator_test.cc"
               ,0xb4,pcVar4);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_88,local_88);
  }
  local_60.data_ =
       (AssertHelperData *)
       (this->t1).settings_.
       super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
       .
       super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
       .
       super__Tuple_impl<2UL,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
       .
       super__Tuple_impl<3UL,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
       .
       super__Head_base<3UL,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>,_false>
       ._M_head_impl.id_;
  local_58 = (((shared_ptr<phmap::priv::(anonymous_namespace)::AllocState> *)
              ((long)&(this->t1).settings_.
                      super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
                      .
                      super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
                      .
                      super__Tuple_impl<2UL,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
                      .
                      super__Tuple_impl<3UL,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
                      .
                      super__Head_base<3UL,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>,_false>
              + 8))->
             super___shared_ptr<phmap::priv::(anonymous_namespace)::AllocState,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
  pCVar3 = (CheckedAlloc<phmap::priv::Tracked<int>,_6> *)
           ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(this->t1).settings_.
                   super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
                   .
                   super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
                   .
                   super__Tuple_impl<2UL,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
                   .
                   super__Tuple_impl<3UL,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
                   .
                   super__Head_base<3UL,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>,_false>
           + 0x10))->_M_pi;
  if (pCVar3 != (CheckedAlloc<phmap::priv::Tracked<int>,_6> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(pCVar3->state_).
               super___shared_ptr<phmap::priv::(anonymous_namespace)::AllocState,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr =
           *(int *)&(pCVar3->state_).
                    super___shared_ptr<phmap::priv::(anonymous_namespace)::AllocState,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr + 1;
      UNLOCK();
    }
    else {
      *(int *)&(pCVar3->state_).
               super___shared_ptr<phmap::priv::(anonymous_namespace)::AllocState,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr =
           *(int *)&(pCVar3->state_).
                    super___shared_ptr<phmap::priv::(anonymous_namespace)::AllocState,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr + 1;
    }
  }
  local_50 = pCVar3;
  if ((AssertHelperData *)(this->a2).id_ == local_60.data_) {
    local_28 = "a2";
    local_30 = "t1.get_allocator()";
    local_38 = "!=";
    testing::AssertionFailure();
    pAVar2 = testing::AssertionResult::operator<<
                       ((AssertionResult *)local_48,(char (*) [12])"Expected: (");
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,&local_28);
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [3])") ");
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,&local_38);
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [3])0x1557b0);
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,&local_30);
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [12])"), actual: ");
    testing::internal::
    FormatForComparisonFailureMessage<phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,6>,phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,6>>
              (&local_b0,(internal *)&this->a2,value,pCVar3);
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,&local_b0);
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [5])" vs ");
    testing::internal::
    FormatForComparisonFailureMessage<phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,6>,phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,6>>
              ((string *)local_90,(internal *)&local_60,value_00,pCVar3);
    pAVar2 = testing::AssertionResult::operator<<
                       (pAVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_90);
    testing::AssertionResult::AssertionResult((AssertionResult *)local_70,pAVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_90._1_7_,local_90[0]) != &local_80) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_90._1_7_,local_90[0]),local_80._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,(ulong)(local_b0.field_2._M_allocated_capacity + 1))
      ;
    }
    if ((_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_40._M_head_impl !=
        (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_40,local_40._M_head_impl);
    }
  }
  else {
    testing::AssertionSuccess();
  }
  if (local_50 != (CheckedAlloc<phmap::priv::Tracked<int>,_6> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50);
  }
  if (local_70[0] == false) {
    testing::Message::Message((Message *)&local_b0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_68._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_68._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_allocator_test.cc"
               ,0xb5,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_68._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_68._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl);
  }
  return;
}

Assistant:

PropagateTest() {
    EXPECT_EQ(a1, t1.get_allocator());
    EXPECT_NE(a2, t1.get_allocator());
  }